

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::ReadBytes(CodedInputStream *input,string *value)

{
  pointer __dest;
  bool bVar1;
  LogMessage *other;
  size_t __n;
  LogFinisher local_5d;
  uint32 length;
  LogMessage local_58;
  
  bVar1 = io::CodedInputStream::ReadVarint32(input,&length);
  if ((bVar1) && (__n = (size_t)(int)length, -1 < (long)__n)) {
    if (*(int *)&input->buffer_end_ - *(int *)&input->buffer_ < (int)length) {
      bVar1 = io::CodedInputStream::ReadStringFallback(input,value,length);
      return bVar1;
    }
    std::__cxx11::string::resize((ulong)value);
    __dest = (value->_M_dataplus)._M_p;
    if (__dest == (pointer)0x0) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream_inl.h"
                 ,0x3c);
      other = LogMessage::operator<<(&local_58,"CHECK failed: z.first != NULL: ");
      LogFinisher::operator=(&local_5d,other);
      LogMessage::~LogMessage(&local_58);
    }
    memcpy(__dest,input->buffer_,__n);
    input->buffer_ = input->buffer_ + __n;
    return true;
  }
  return false;
}

Assistant:

bool WireFormatLite::ReadBytes(io::CodedInputStream* input, string* value) {
  return ReadBytesToString(input, value);
}